

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

bool __thiscall SQInstance::GetMetaMethod(SQInstance *this,SQVM *v,SQMetaMethod mm,SQObjectPtr *res)

{
  bool bVar1;
  SQObjectPtr *res_local;
  SQMetaMethod mm_local;
  SQVM *v_local;
  SQInstance *this_local;
  
  bVar1 = this->_class->_metamethods[mm].super_SQObject._type != OT_NULL;
  if (bVar1) {
    ::SQObjectPtr::operator=(res,this->_class->_metamethods + mm);
  }
  return bVar1;
}

Assistant:

bool SQInstance::GetMetaMethod(SQVM* SQ_UNUSED_ARG(v),SQMetaMethod mm,SQObjectPtr &res)
{
    if(type(_class->_metamethods[mm]) != OT_NULL) {
        res = _class->_metamethods[mm];
        return true;
    }
    return false;
}